

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageEllipse(gdImagePtr im,int mx,int my,int w,int h,int c)

{
  long lVar1;
  long lVar2;
  long b;
  long a;
  long ry;
  long rx;
  long r;
  long dy;
  long dx;
  long bq;
  long aq;
  int my2;
  int my1;
  int mx2;
  int mx1;
  int x;
  int c_local;
  int h_local;
  int w_local;
  int my_local;
  int mx_local;
  gdImagePtr im_local;
  
  mx2 = w >> 1;
  lVar1 = (long)mx2;
  gdImageSetPixel(im,mx + mx2,my,c);
  gdImageSetPixel(im,mx - mx2,my,c);
  my1 = mx - mx2;
  my2 = mx + mx2;
  lVar2 = (long)(h >> 1) * (long)(h >> 1);
  rx = lVar1 * lVar2;
  ry = rx * 2;
  a = 0;
  aq._0_4_ = my;
  aq._4_4_ = my;
  while (0 < mx2) {
    if (0 < rx) {
      aq._4_4_ = aq._4_4_ + 1;
      aq._0_4_ = (int)aq + -1;
      a = lVar1 * lVar1 * 2 + a;
      rx = rx - a;
    }
    if (rx < 1) {
      mx2 = mx2 + -1;
      my1 = my1 + 1;
      my2 = my2 + -1;
      ry = ry + lVar2 * -2;
      rx = ry + rx;
    }
    gdImageSetPixel(im,my1,aq._4_4_,c);
    gdImageSetPixel(im,my1,(int)aq,c);
    gdImageSetPixel(im,my2,aq._4_4_,c);
    gdImageSetPixel(im,my2,(int)aq,c);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageEllipse(gdImagePtr im, int mx, int my, int w, int h, int c)
{
	int x=0,mx1=0,mx2=0,my1=0,my2=0;
	long aq,bq,dx,dy,r,rx,ry,a,b;

	a=w>>1;
	b=h>>1;
	gdImageSetPixel(im,mx+a, my, c);
	gdImageSetPixel(im,mx-a, my, c);
	mx1 = mx-a;
	my1 = my;
	mx2 = mx+a;
	my2 = my;

	aq = a * a;
	bq = b * b;
	dx = aq << 1;
	dy = bq << 1;
	r  = a * bq;
	rx = r << 1;
	ry = 0;
	x = a;
	while (x > 0) {
		if (r > 0) {
			my1++;
			my2--;
			ry +=dx;
			r  -=ry;
		}
		if (r <= 0) {
			x--;
			mx1++;
			mx2--;
			rx -=dy;
			r  +=rx;
		}
		gdImageSetPixel(im,mx1, my1, c);
		gdImageSetPixel(im,mx1, my2, c);
		gdImageSetPixel(im,mx2, my1, c);
		gdImageSetPixel(im,mx2, my2, c);
	}
}